

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-test-compare.cc
# Opt level: O0

string * compare_abi_cxx11_(string *__return_storage_ptr__,char *actual_filename,
                           char *expected_filename,char *password)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  size_type sVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  reference pvVar6;
  allocator<char> local_191;
  QPDFObjectHandle local_190;
  QPDFObjectHandle local_180;
  string local_170;
  byte local_14a;
  allocator<char> local_149;
  QPDFObjGen local_148;
  QPDFObjGen exp_og;
  QPDFObjGen act_og;
  value_type exp;
  value_type act;
  size_t i;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_108 [8];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> expected_objects;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_f0 [8];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> actual_objects;
  QPDFObjectHandle local_d0;
  QPDFObjectHandle local_c0;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_88 [8];
  string trailer_diff;
  QPDFObjectHandle exp_trailer;
  QPDFObjectHandle act_trailer;
  QPDF expected;
  QPDF local_30 [8];
  QPDF actual;
  char *password_local;
  char *expected_filename_local;
  char *actual_filename_local;
  string *ret;
  
  _actual = password;
  QPDF::QPDF(local_30);
  QPDF::processFile((char *)local_30,actual_filename);
  QPDF::QPDF((QPDF *)&act_trailer.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDF::processFile((char *)&act_trailer.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                    expected_filename);
  QPDF::getTrailer();
  QPDF::getTrailer();
  cleanTrailer((QPDFObjectHandle *)
               &exp_trailer.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  cleanTrailer((QPDFObjectHandle *)((long)&trailer_diff.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"trailer",&local_a9);
  QPDFObjectHandle::QPDFObjectHandle
            (&local_c0,
             (QPDFObjectHandle *)
             &exp_trailer.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::QPDFObjectHandle
            (&local_d0,(QPDFObjectHandle *)((long)&trailer_diff.field_2 + 8));
  compareObjects((string *)local_88,&local_a8,&local_c0,&local_d0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_d0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_c0);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    QTC::TC("compare","different trailer",0);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_88);
  }
  else {
    cleanEncryption(local_30);
    cleanEncryption((QPDF *)&act_trailer.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    QPDF::getAllObjects();
    QPDF::getAllObjects();
    sVar3 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size(local_f0);
    sVar4 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size(local_108);
    if (sVar3 == sVar4) {
      for (act.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size(local_f0),
          act.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi < p_Var5;
          act.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               act.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi + 1) {
        pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator[]
                           (local_f0,(size_type)
                                     act.super_BaseHandle.obj.
                                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi);
        QPDFObjectHandle::QPDFObjectHandle
                  ((QPDFObjectHandle *)
                   &exp.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pvVar6);
        pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator[]
                           (local_108,
                            (size_type)
                            act.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi);
        QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&act_og,pvVar6);
        exp_og = (QPDFObjGen)QPDFObjectHandle::getObjGen();
        local_148 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
        bVar1 = QPDFObjGen::operator!=(&exp_og,&local_148);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"different object IDs",&local_149);
          std::allocator<char>::~allocator(&local_149);
          bVar1 = true;
        }
        else {
          local_14a = 0;
          QPDFObjGen::unparse_abi_cxx11_(&local_170,&exp_og,',');
          QPDFObjectHandle::QPDFObjectHandle
                    (&local_180,
                     (QPDFObjectHandle *)
                     &exp.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          QPDFObjectHandle::QPDFObjectHandle(&local_190,(QPDFObjectHandle *)&act_og);
          compareObjects(__return_storage_ptr__,&local_170,&local_180,&local_190);
          QPDFObjectHandle::~QPDFObjectHandle(&local_190);
          QPDFObjectHandle::~QPDFObjectHandle(&local_180);
          std::__cxx11::string::~string((string *)&local_170);
          uVar2 = std::__cxx11::string::empty();
          bVar1 = (uVar2 & 1) == 0;
          if (bVar1) {
            local_14a = 1;
          }
          if ((local_14a & 1) == 0) {
            std::__cxx11::string::~string((string *)__return_storage_ptr__);
          }
        }
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&act_og);
        QPDFObjectHandle::~QPDFObjectHandle
                  ((QPDFObjectHandle *)
                   &exp.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        if (bVar1) goto LAB_00106182;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_191);
      std::allocator<char>::~allocator(&local_191);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"different number of objects",
                 (allocator<char> *)((long)&i + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
    }
LAB_00106182:
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(local_108);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(local_f0);
  }
  std::__cxx11::string::~string((string *)local_88);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)((long)&trailer_diff.field_2 + 8));
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &exp_trailer.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDF::~QPDF((QPDF *)&act_trailer.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDF::~QPDF(local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string
compare(char const* actual_filename, char const* expected_filename, char const* password)
{
    QPDF actual;
    actual.processFile(actual_filename, password);
    QPDF expected;
    expected.processFile(expected_filename, password);
    // The motivation behind this program is to compare files in a way that allows for
    // differences in the exact bytes of zlib compression. If all zlib implementations produced
    // exactly the same output, we would just be able to use straight comparison, but since they
    // don't, we use this. As such, we are enforcing a standard of "sameness" that goes beyond
    // showing semantic equivalence. The only difference we are allowing is compressed data.

    auto act_trailer = actual.getTrailer();
    auto exp_trailer = expected.getTrailer();
    cleanTrailer(act_trailer);
    cleanTrailer(exp_trailer);
    auto trailer_diff = compareObjects("trailer", act_trailer, exp_trailer);
    if (!trailer_diff.empty()) {
        QTC::TC("compare", "different trailer");
        return trailer_diff;
    }

    cleanEncryption(actual);
    cleanEncryption(expected);

    auto actual_objects = actual.getAllObjects();
    auto expected_objects = expected.getAllObjects();
    if (actual_objects.size() != expected_objects.size()) {
        // Not exercised in the test suite since the trailers will differ in this case.
        return "different number of objects";
    }
    for (size_t i = 0; i < actual_objects.size(); ++i) {
        auto act = actual_objects[i];
        auto exp = expected_objects[i];
        auto act_og = act.getObjGen();
        auto exp_og = exp.getObjGen();
        if (act_og != exp_og) {
            // not reproduced in the test suite
            return "different object IDs";
        }
        auto ret = compareObjects(act_og.unparse(), act, exp);
        if (!ret.empty()) {
            return ret;
        }
    }
    return "";
}